

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:766:13)>
::destroy(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:766:13)>
          *this)

{
  SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:766:13)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,capnp::BufferedMessageStream::tryReadMessageImpl(kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }